

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes
          (XmlUnitTestResultPrinter *this,TestResult *result)

{
  XmlUnitTestResultPrinter *this_00;
  XmlUnitTestResultPrinter *pXVar1;
  TestProperty *pTVar2;
  Message *pMVar3;
  size_t extraout_RDX;
  int i;
  String SVar4;
  Message attributes;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  XmlUnitTestResultPrinter *local_50;
  char *local_48 [3];
  
  local_50 = this;
  Message::Message((Message *)&local_58);
  this_00 = (XmlUnitTestResultPrinter *)(local_48 + 1);
  for (i = 0; pXVar1 = local_50,
      i < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5); i = i + 1) {
    pTVar2 = TestResult::GetTestProperty(result,i);
    pMVar3 = Message::operator<<((Message *)&local_58,(char (*) [2])0x18521b);
    local_48[0] = (pTVar2->key_).c_str_;
    pMVar3 = Message::operator<<(pMVar3,local_48);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x18e4a9);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x18e753);
    EscapeXmlAttribute(this_00,(pTVar2->value_).c_str_);
    pMVar3 = Message::operator<<(pMVar3,(String *)this_00);
    Message::operator<<(pMVar3,(char (*) [2])0x18e753);
    String::~String((String *)this_00);
  }
  StringStreamToString((internal *)local_50,local_58.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_58);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)pXVar1;
  return SVar4;
}

Assistant:

String XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}